

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx11.cc
# Opt level: O2

bool pairwise_equal<int,double,double,std::__cxx11::string,std::__cxx11::string>
               (int *a,int *b,double rest,double rest_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_3)

{
  __type_conflict _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (*a == *b) {
    std::__cxx11::string::string((string *)&local_48,(string *)rest_2);
    std::__cxx11::string::string((string *)&local_28,(string *)rest_3);
    if ((rest != rest_1) || (NAN(rest) || NAN(rest_1))) {
      _Var1 = false;
    }
    else {
      _Var1 = std::operator==(&local_48,&local_28);
    }
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool
pairwise_equal(A const& a, A const& b)
{
    return (a == b);
}